

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_clib_index(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  void *ptr_00;
  jit_State *pjVar2;
  IRRef1 IVar3;
  CTypeID CVar4;
  TRef TVar5;
  cTValue *J_00;
  long *in_RSI;
  jit_State *in_RDI;
  TRef ptr;
  void *sp;
  CTypeID sid;
  cTValue *tv;
  CTypeID id;
  CType *ct;
  GCstr *name;
  CLibrary *cl;
  CTState *cts;
  CType *ct_1;
  TValue tv_1;
  undefined4 in_stack_fffffffffffffed8;
  TraceError in_stack_fffffffffffffedc;
  jit_State *in_stack_fffffffffffffee0;
  jit_State *J_01;
  undefined2 in_stack_fffffffffffffee8;
  int32_t in_stack_fffffffffffffeec;
  jit_State *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  jit_State *local_f0;
  GCstr *local_e8;
  long local_e0;
  cTValue *local_d8;
  long *local_d0;
  jit_State *local_c8;
  jit_State *local_c0;
  IROp local_b4;
  cTValue *local_b0;
  undefined2 in_stack_ffffffffffffff58;
  TRef sp_00;
  jit_State *s;
  jit_State *in_stack_ffffffffffffff68;
  cTValue *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  CType *in_stack_ffffffffffffff80;
  jit_State *in_stack_ffffffffffffff88;
  
  local_d8 = (cTValue *)(ulong)in_RDI[-1].bpropcache[0xc].mode;
  if ((((*in_RDI->base & 0x1f000000) == 0xc000000) && ((in_RDI->base[1] & 0x1f000000) == 0x4000000))
     && (*(char *)((ulong)*(uint *)*in_RSI + 6) == '\x02')) {
    local_e0 = (ulong)*(uint *)*in_RSI + 0x18;
    local_e8 = (GCstr *)(ulong)*(uint *)(*in_RSI + 8);
    local_d0 = in_RSI;
    local_c8 = in_RDI;
    CVar4 = lj_ctype_getname((CTState *)&local_d8->field_2,(CType **)&local_f0,local_e8,0x1840);
    J_00 = lj_tab_getstr(*(GCtab **)(local_e0 + 8),local_e8);
    local_d0[1] = (ulong)*(uint *)(local_d0 + 2);
    if (((CVar4 == 0) || (J_00 == (cTValue *)0x0)) || ((J_00->field_2).it == 0xffffffff)) {
      lj_trace_err(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    }
    IVar3 = (IRRef1)local_c8->base[1];
    J_01 = local_c8;
    TVar5 = lj_ir_kgc((jit_State *)&J_00->field_2,
                      (GCobj *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      (IRType)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    CVar4 = CONCAT22(0x884,IVar3);
    sp_00 = CONCAT22((IRRef1)TVar5,in_stack_ffffffffffffff58);
    (J_01->fold).ins.field_0.ot = 0x884;
    (J_01->fold).ins.field_0.op1 = IVar3;
    (J_01->fold).ins.field_0.op2 = (IRRef1)TVar5;
    s = J_01;
    lj_opt_fold((jit_State *)
                CONCAT44(in_stack_fffffffffffffeec,CONCAT22(IVar3,in_stack_fffffffffffffee8)));
    if ((local_f0->cur).nextgc.gcptr32 >> 0x1c == 0xb) {
      uVar1._0_1_ = (local_f0->cur).marked;
      uVar1._1_1_ = (local_f0->cur).gct;
      uVar1._2_2_ = (local_f0->cur).nsnap;
      if ((uVar1 < 0x80000000) ||
         ((*(uint *)(local_d8->u64 + (ulong)((local_f0->cur).nextgc.gcptr32 & 0xffff) * 0x10) &
          0x800000) == 0)) {
        TVar5 = lj_ir_kint(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        *local_c8->base = TVar5;
      }
      else {
        TVar5 = lj_ir_knum_u64(J_01,CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        *local_c8->base = TVar5;
      }
    }
    else if ((local_f0->cur).nextgc.gcptr32 >> 0x1c == 0xc) {
      local_b4 = (local_f0->cur).nextgc.gcptr32 & 0xffff;
      ptr_00 = *(void **)((ulong)(J_00->u32).lo + 8);
      local_b0 = local_d8;
      pjVar2 = (jit_State *)(local_d8->u64 + (ulong)local_b4 * 0x10);
      while (local_c0 = pjVar2, (local_c0->cur).nextgc.gcptr32 >> 0x1c == 8) {
        pjVar2 = (jit_State *)
                 (local_d8->u64 + (ulong)((local_c0->cur).nextgc.gcptr32 & 0xffff) * 0x10);
        in_stack_ffffffffffffff68 = local_c0;
        in_stack_ffffffffffffff70 = local_d8;
      }
      local_f0 = local_c0;
      if (ptr_00 == (void *)((ulong)ptr_00 & 0xffffffff)) {
        lj_ir_kptr_((jit_State *)&J_00->field_2,local_b4,ptr_00);
      }
      else {
        lj_ir_kint64(J_01,CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      }
      if ((int)local_d0[2] == 0) {
        local_c8->needsnap = '\x01';
        crec_ct_tv(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                   (TRef)((ulong)in_stack_ffffffffffffff78 >> 0x20),(TRef)in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70);
      }
      else {
        TVar5 = crec_tv_ct(in_stack_ffffffffffffff68,(CType *)s,CVar4,sp_00);
        *local_c8->base = TVar5;
      }
    }
    else {
      TVar5 = lj_ir_kgc((jit_State *)&J_00->field_2,
                        (GCobj *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                        (IRType)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      *local_c8->base = TVar5;
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_clib_index(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  if (tref_isudata(J->base[0]) && tref_isstr(J->base[1]) &&
      udataV(&rd->argv[0])->udtype == UDTYPE_FFI_CLIB) {
    CLibrary *cl = (CLibrary *)uddata(udataV(&rd->argv[0]));
    GCstr *name = strV(&rd->argv[1]);
    CType *ct;
    CTypeID id = lj_ctype_getname(cts, &ct, name, CLNS_INDEX);
    cTValue *tv = lj_tab_getstr(cl->cache, name);
    rd->nres = rd->data;
    if (id && tv && !tvisnil(tv)) {
      /* Specialize to the symbol name and make the result a constant. */
      emitir(IRTG(IR_EQ, IRT_STR), J->base[1], lj_ir_kstr(J, name));
      if (ctype_isconstval(ct->info)) {
	if (ct->size >= 0x80000000u &&
	    (ctype_child(cts, ct)->info & CTF_UNSIGNED))
	  J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)ct->size);
	else
	  J->base[0] = lj_ir_kint(J, (int32_t)ct->size);
      } else if (ctype_isextern(ct->info)) {
	CTypeID sid = ctype_cid(ct->info);
	void *sp = *(void **)cdataptr(cdataV(tv));
	TRef ptr;
	ct = ctype_raw(cts, sid);
	if (LJ_64 && !checkptr32(sp))
	  ptr = lj_ir_kintp(J, (uintptr_t)sp);
	else
	  ptr = lj_ir_kptr(J, sp);
	if (rd->data) {
	  J->base[0] = crec_tv_ct(J, ct, sid, ptr);
	} else {
	  J->needsnap = 1;
	  crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
	}
      } else {
	J->base[0] = lj_ir_kgc(J, obj2gco(cdataV(tv)), IRT_CDATA);
      }
    } else {
      lj_trace_err(J, LJ_TRERR_NOCACHE);
    }
  }  /* else: interpreter will throw. */
}